

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

uint32_t __thiscall rcg::Buffer::getNumberOfParts(Buffer *this)

{
  element_type *peVar1;
  void *pvVar2;
  unsigned_long uVar3;
  undefined8 *in_RDI;
  size_t type;
  uint32_t ret;
  undefined8 in_stack_ffffffffffffffd8;
  BUFFER_INFO_CMD cmd;
  PDSGetNumBufferParts p_Var4;
  void *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  uint32_t uVar5;
  
  cmd = (BUFFER_INFO_CMD)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  uVar5 = 0;
  if ((*(byte *)(in_RDI + 5) & 1) == 0) {
    Stream::getHandle((Stream *)*in_RDI);
    uVar3 = anon_unknown_5::getBufferValue<unsigned_long>
                      ((shared_ptr<const_rcg::GenTLWrapper> *)
                       CONCAT44(uVar5,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,in_RDI,
                       cmd);
    if (uVar3 != 8) {
      uVar5 = 1;
    }
  }
  else {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1279bf);
    p_Var4 = peVar1->DSGetNumBufferParts;
    pvVar2 = Stream::getHandle((Stream *)*in_RDI);
    (*p_Var4)(pvVar2,(BUFFER_HANDLE)in_RDI[3],(uint32_t *)&stack0xfffffffffffffff4);
  }
  return uVar5;
}

Assistant:

uint32_t Buffer::getNumberOfParts() const
{
  uint32_t ret=0;

  if (multipart)
  {
    gentl->DSGetNumBufferParts(parent->getHandle(), buffer, &ret);
  }
  else
  {
    size_t type=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                       GenTL::BUFFER_INFO_PAYLOADTYPE);

    if (type != PAYLOAD_TYPE_CHUNK_ONLY)
    {
      ret=1;
    }
  }

  return ret;
}